

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agent.c
# Opt level: O1

void * agent_main(void *arg)

{
  uint uVar1;
  int iVar2;
  pthread_t __th;
  time_t tVar3;
  long in_FS_OFFSET;
  cpu_set_t cpuset;
  cpu_set_t local_98;
  
  __th = pthread_self();
  *(int *)(in_FS_OFFSET + -0x628) = (int)arg;
  init_per_thread_stats();
  tVar3 = time((time_t *)0x0);
  srand(*(int *)(in_FS_OFFSET + -0x628) * 0x3039 + (int)tVar3);
  local_98.__bits[0xe] = 0;
  local_98.__bits[0xf] = 0;
  local_98.__bits[0xc] = 0;
  local_98.__bits[0xd] = 0;
  local_98.__bits[10] = 0;
  local_98.__bits[0xb] = 0;
  local_98.__bits[8] = 0;
  local_98.__bits[9] = 0;
  local_98.__bits[6] = 0;
  local_98.__bits[7] = 0;
  local_98.__bits[4] = 0;
  local_98.__bits[5] = 0;
  local_98.__bits[2] = 0;
  local_98.__bits[3] = 0;
  local_98.__bits[0] = 0;
  local_98.__bits[1] = 0;
  uVar1 = *(uint *)(in_FS_OFFSET + -0x628);
  if (uVar1 < 0x400) {
    local_98.__bits[uVar1 >> 6] = local_98.__bits[uVar1 >> 6] | 1L << ((byte)uVar1 & 0x3f);
  }
  iVar2 = pthread_setaffinity_np(__th,0x80,&local_98);
  if (iVar2 == 0) {
    (*cfg->tp->tp_main[cfg->atype])();
  }
  else {
    agent_main_cold_1();
  }
  return (void *)0x0;
}

Assistant:

static void *agent_main(void *arg)
{
	cpu_set_t cpuset;
	pthread_t thread;
	int s;

	thread = pthread_self();
	thread_idx = (int)(long)arg;
	init_per_thread_stats();

	srand(time(NULL) + thread_idx * 12345);

	CPU_ZERO(&cpuset);
	CPU_SET(thread_idx, &cpuset);

	s = pthread_setaffinity_np(thread, sizeof(cpu_set_t), &cpuset);
	if (s != 0) {
		lancet_perror("pthread_setaffinity_np");
		return NULL;
	}
	cfg->tp->tp_main[cfg->atype]();

	return NULL;
}